

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModportNamedPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportNamedPortSyntax,slang::syntax::ModportNamedPortSyntax_const&>
          (BumpAllocator *this,ModportNamedPortSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  ModportNamedPortSyntax *pMVar8;
  
  pMVar8 = (ModportNamedPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportNamedPortSyntax *)this->endPtr < pMVar8 + 1) {
    pMVar8 = (ModportNamedPortSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pMVar8 + 1);
  }
  (pMVar8->name).info = (args->name).info;
  SVar6 = (args->super_ModportPortSyntax).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_ModportPortSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ModportPortSyntax).super_SyntaxNode.parent;
  TVar2 = (args->name).kind;
  uVar3 = (args->name).field_0x2;
  NVar4.raw = (args->name).numFlags.raw;
  uVar5 = (args->name).rawLen;
  (pMVar8->super_ModportPortSyntax).super_SyntaxNode.previewNode =
       (args->super_ModportPortSyntax).super_SyntaxNode.previewNode;
  (pMVar8->name).kind = TVar2;
  (pMVar8->name).field_0x2 = uVar3;
  (pMVar8->name).numFlags = (NumericTokenFlags)NVar4.raw;
  (pMVar8->name).rawLen = uVar5;
  (pMVar8->super_ModportPortSyntax).super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pMVar8->super_ModportPortSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pMVar8->super_ModportPortSyntax).super_SyntaxNode.parent = pSVar1;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }